

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSamplerStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType queryType;
  TestContext *testCtx;
  RenderContext *renderCtx;
  anon_struct_24_3_b27fdac0 *paVar1;
  long *plVar2;
  TestNode *node;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  allocator<char> local_d1;
  anon_struct_24_3_b27fdac0 *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  long local_68;
  TestNode *local_60;
  char *local_58;
  string local_50;
  
  local_68 = 0;
  local_60 = (TestNode *)this;
  do {
    local_d0 = init::states + local_68;
    local_58 = local_d0->name;
    lVar5 = 0;
    do {
      queryType = *(QueryType *)
                   ((long)gles31::Functional::SamplerStateQueryTests::init()::nonPureVerifiers +
                   lVar5);
      testCtx = ((TestNode *)this)->m_testCtx;
      renderCtx = ((Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode)->m_renderCtx;
      local_88 = &local_78;
      local_80 = 0;
      local_78 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_c8 = &local_b8;
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_b8 = *plVar3;
        lStack_b0 = plVar2[3];
      }
      else {
        local_b8 = *plVar3;
        local_c8 = (long *)*plVar2;
      }
      local_c0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
      paVar1 = local_d0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_a8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_d0->desc,&local_d1);
      node = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                        (testCtx,renderCtx,&local_a8,&local_50,queryType,paVar1->tester)->
              super_TestNode;
      this = (SamplerStateQueryTests *)local_60;
      tcu::TestNode::addChild(local_60,node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    local_68 = local_68 + 1;
  } while (local_68 != 9);
  return 9;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType verifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
	} states[] =
	{
		{ "sampler_texture_wrap_s",				"TEXTURE_WRAP_S",			TESTER_TEXTURE_WRAP_S			},
		{ "sampler_texture_wrap_t",				"TEXTURE_WRAP_T",			TESTER_TEXTURE_WRAP_T			},
		{ "sampler_texture_wrap_r",				"TEXTURE_WRAP_R",			TESTER_TEXTURE_WRAP_R			},
		{ "sampler_texture_mag_filter",			"TEXTURE_MAG_FILTER",		TESTER_TEXTURE_MAG_FILTER		},
		{ "sampler_texture_min_filter",			"TEXTURE_MIN_FILTER",		TESTER_TEXTURE_MIN_FILTER		},
		{ "sampler_texture_min_lod",			"TEXTURE_MIN_LOD",			TESTER_TEXTURE_MIN_LOD			},
		{ "sampler_texture_max_lod",			"TEXTURE_MAX_LOD",			TESTER_TEXTURE_MAX_LOD			},
		{ "sampler_texture_compare_mode",		"TEXTURE_COMPARE_MODE",		TESTER_TEXTURE_COMPARE_MODE		},
		{ "sampler_texture_compare_func",		"TEXTURE_COMPARE_FUNC",		TESTER_TEXTURE_COMPARE_FUNC		},
	};

	for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(createSamplerParamTest(m_testCtx,
																	 m_context.getRenderContext(),
																	 std::string() + states[stateNdx].name + getVerifierSuffix(verifier),
																	 states[stateNdx].desc,
																	 verifier,
																	 states[stateNdx].tester)));
	}
}